

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Radio_Communications_Header.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Radio_Communications_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Radio_Communications_Header *this)

{
  ostream *poVar1;
  ulong uVar2;
  ushort uVar3;
  KStringStream ss;
  char local_381;
  KString local_380;
  long *local_360;
  long local_358;
  long local_350 [2];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"Entity ID:\n",0xb);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_380,&this->m_EntityID);
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_381 = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_381,1);
  if (local_380._M_string_length != 0) {
    uVar3 = 1;
    uVar2 = 0;
    do {
      local_381 = local_380._M_dataplus._M_p[uVar2];
      if ((local_380._M_string_length - 1 == uVar2) || (local_381 != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_381,1);
      }
      else {
        local_381 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_381,1);
        local_381 = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_381,1);
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 < local_380._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_360,local_358)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Radio ID:        ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  return __return_storage_ptr__;
}

Assistant:

KString Radio_Communications_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Entity ID:\n"
       << IndentString( m_EntityID.GetAsString(), 1 )
       << "Radio ID:        " << m_ui16RadioID << "\n";

    return ss.str();
}